

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImRect *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiNavLayer IVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  float fVar7;
  
  pIVar5 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1ea2,"void ImGui::SetFocusID(ImGuiID, ImGuiWindow *)");
  }
  IVar4 = (window->DC).NavLayerCurrent;
  if (GImGui->NavWindow != window) {
    GImGui->NavInitRequest = false;
  }
  pIVar5->NavWindow = window;
  pIVar5->NavId = id;
  pIVar5->NavLayer = IVar4;
  pIVar5->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
  window->NavLastIds[IVar4] = id;
  if ((window->DC).LastItemId == id) {
    IVar2 = (window->DC).LastItemRect.Min;
    IVar3 = (window->DC).LastItemRect.Max;
    fVar6 = (window->Pos).x;
    fVar7 = (window->Pos).y;
    pIVar1 = window->NavRectRel + IVar4;
    (pIVar1->Min).x = IVar2.x - fVar6;
    (pIVar1->Min).y = IVar2.y - fVar7;
    (pIVar1->Max).x = IVar3.x - fVar6;
    (pIVar1->Max).y = IVar3.y - fVar7;
  }
  if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar5->NavDisableMouseHover = true;
    return;
  }
  pIVar5->NavDisableHighlight = true;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (window->DC.LastItemId == id)
        window->NavRectRel[nav_layer] = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}